

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void vmsa_ttbr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  _Bool _Var1;
  uint64_t uVar2;
  ArchCPU_conflict2 *cpu_00;
  ARMCPU_conflict1 *cpu;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  _Var1 = cpreg_field_is_64bit(ri);
  if (_Var1) {
    uVar2 = raw_read(env,ri);
    uVar2 = extract64(uVar2 ^ value,0x30,0x10);
    if (uVar2 != 0) {
      cpu_00 = env_archcpu(env);
      tlb_flush_aarch64(&cpu_00->parent_obj);
    }
  }
  raw_write(env,ri,value);
  return;
}

Assistant:

static void vmsa_ttbr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                            uint64_t value)
{
    /* If the ASID changes (with a 64-bit write), we must flush the TLB.  */
    if (cpreg_field_is_64bit(ri) &&
        extract64(raw_read(env, ri) ^ value, 48, 16) != 0) {
        ARMCPU *cpu = env_archcpu(env);
        tlb_flush(CPU(cpu));
    }
    raw_write(env, ri, value);
}